

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::internal::GeneratedMessageReflection::FindKnownExtensionByName
          (GeneratedMessageReflection *this,string *name)

{
  long lVar1;
  Type TVar2;
  FieldDescriptor *pFVar3;
  Descriptor *pDVar4;
  Descriptor *pDVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  FieldDescriptor *local_38;
  
  if ((this->schema_).extensions_offset_ == -1) {
    return (FieldDescriptor *)0x0;
  }
  pFVar3 = DescriptorPool::FindExtensionByName(this->descriptor_pool_,name);
  if ((pFVar3 == (FieldDescriptor *)0x0) || (*(Descriptor **)(pFVar3 + 0x58) != this->descriptor_))
  {
    if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x68) == '\x01') {
      pDVar4 = DescriptorPool::FindMessageTypeByName(this->descriptor_pool_,name);
      if (pDVar4 == (Descriptor *)0x0) {
        bVar9 = true;
      }
      else {
        uVar6 = (ulong)*(int *)(pDVar4 + 0x78);
        bVar9 = (long)uVar6 < 1;
        if (0 < (long)uVar6) {
          lVar7 = 0x4c;
          uVar8 = 1;
          do {
            lVar1 = *(long *)(pDVar4 + 0x80);
            if (*(Descriptor **)(lVar1 + 0xc + lVar7) == this->descriptor_) {
              pFVar3 = (FieldDescriptor *)(lVar1 + lVar7 + -0x4c);
              TVar2 = FieldDescriptor::type(pFVar3);
              if (((TVar2 != TYPE_MESSAGE) || (*(int *)(lVar1 + lVar7) != 1)) ||
                 (pDVar5 = FieldDescriptor::message_type(pFVar3), pDVar5 != pDVar4))
              goto LAB_0031e387;
              bVar10 = false;
              local_38 = pFVar3;
            }
            else {
LAB_0031e387:
              bVar10 = true;
            }
            if (!bVar10) break;
            bVar9 = uVar6 <= uVar8;
            lVar7 = lVar7 + 0xa8;
            bVar10 = uVar8 != uVar6;
            uVar8 = uVar8 + 1;
          } while (bVar10);
        }
      }
      if (!bVar9) {
        return local_38;
      }
    }
    pFVar3 = (FieldDescriptor *)0x0;
  }
  return pFVar3;
}

Assistant:

bool HasExtensionSet() const { return extensions_offset_ != -1; }